

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O2

void setup_lattice(Vector *v,long *ix,long *iy,long *iz,long *jx,long *jy,long *jz,double *sx,
                  double *sy,double *sz,double *tx,double *ty,double *tz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = v->x + 10000.0;
  dVar2 = v->y + 10000.0;
  v->x = dVar1;
  v->y = dVar2;
  dVar3 = v->z + 10000.0;
  v->z = dVar3;
  *ix = (long)dVar1;
  *iy = (long)dVar2;
  *iz = (long)dVar3;
  *jx = *ix + 1;
  *jy = *iy + 1;
  *jz = *iz + 1;
  dVar1 = dVar1 - (double)*ix;
  *sx = (3.0 - (dVar1 + dVar1)) * dVar1 * dVar1;
  dVar1 = v->y - (double)*iy;
  *sy = (3.0 - (dVar1 + dVar1)) * dVar1 * dVar1;
  dVar1 = v->z - (double)*iz;
  *sz = (3.0 - (dVar1 + dVar1)) * dVar1 * dVar1;
  *tx = 1.0 - *sx;
  *ty = 1.0 - *sy;
  *tz = 1.0 - *sz;
  return;
}

Assistant:

void setup_lattice(  Vector&  v,
          long& ix,long&   iy,long& iz,
          long& jx,long&   jy,long& jz,
          double& sx,double&  sy,double& sz,
          double& tx,double&  ty,double& tz )
{
   // ensure values are positive
   v.x   -= MINX;
   v.y   -= MINY;
   v.z   -= MINZ;

   // integer lattice point
   ix = (long)v.x;   iy = (long)v.y;   iz = (long)v.z;
   jx = ix  + 1; jy  = iy + 1; jz = iz +  1;

   sx = spline(v.x   - ix); sy = spline(v.y - iy); sz = spline(v.z - iz);
   // complement values of sx,sy,sz
   tx = 1.0 - sx; ty =  1.0   - sy; tz = 1.0 - sz;
}